

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateOneCdataElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlElementType xVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  xmlNodePtr value;
  
  iVar4 = 0;
  if ((ctxt != (xmlValidCtxtPtr)0x0) && (iVar4 = 0, doc->type == XML_ELEMENT_NODE)) {
    value = doc->children;
    iVar4 = 1;
joined_r0x00193eba:
    if (value != (xmlNodePtr)0x0) {
      xVar1 = value->type;
      if (XML_COMMENT_NODE < xVar1) {
LAB_00193f5c:
        iVar4 = 0;
        goto LAB_00193f5e;
      }
      if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        if (xVar1 != XML_ENTITY_REF_NODE) goto LAB_00193f5c;
        if ((value->children == (_xmlNode *)0x0) || (value->children->children == (_xmlNode *)0x0))
        goto LAB_00193ed7;
        nodeVPush(ctxt,value);
        value = value->children->children;
      }
      else {
LAB_00193ed7:
        do {
          value = value->next;
          if (value != (_xmlNode *)0x0) goto joined_r0x00193eba;
          iVar2 = ctxt->nodeNr;
          lVar3 = (long)iVar2;
          if (lVar3 < 1) {
            value = (xmlNodePtr)0x0;
          }
          else {
            ctxt->nodeNr = iVar2 + -1;
            if (iVar2 == 1) {
              ctxt->node = (xmlNodePtr)0x0;
            }
            else {
              ctxt->node = ctxt->nodeTab[lVar3 + -2];
            }
            value = ctxt->nodeTab[lVar3 + -1];
            ctxt->nodeTab[lVar3 + -1] = (xmlNodePtr)0x0;
          }
        } while (value != (xmlNodePtr)0x0);
        value = (xmlNodePtr)0x0;
      }
      goto joined_r0x00193eba;
    }
LAB_00193f5e:
    ctxt->nodeNr = 0;
    ctxt->nodeMax = 0;
    if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
      (*xmlFree)(ctxt->nodeTab);
      ctxt->nodeTab = (xmlNodePtr *)0x0;
    }
  }
  return iVar4;
}

Assistant:

static int
xmlValidateOneCdataElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                           xmlNodePtr elem) {
    int ret = 1;
    xmlNodePtr cur, child;

    if ((ctxt == NULL) || (doc == NULL) || (elem == NULL) ||
        (elem->type != XML_ELEMENT_NODE))
	return(0);

    child = elem->children;

    cur = child;
    while (cur != NULL) {
	switch (cur->type) {
	    case XML_ENTITY_REF_NODE:
		/*
		 * Push the current node to be able to roll back
		 * and process within the entity
		 */
		if ((cur->children != NULL) &&
		    (cur->children->children != NULL)) {
		    nodeVPush(ctxt, cur);
		    cur = cur->children->children;
		    continue;
		}
		break;
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		break;
	    default:
		ret = 0;
		goto done;
	}
	/*
	 * Switch to next element
	 */
	cur = cur->next;
	while (cur == NULL) {
	    cur = nodeVPop(ctxt);
	    if (cur == NULL)
		break;
	    cur = cur->next;
	}
    }
done:
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    if (ctxt->nodeTab != NULL) {
	xmlFree(ctxt->nodeTab);
	ctxt->nodeTab = NULL;
    }
    return(ret);
}